

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int get_obmc_mvpred_var(FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *this_mv)

{
  int32_t *piVar1;
  int32_t *piVar2;
  aom_variance_fn_ptr_t *paVar3;
  buf_2d *pbVar4;
  MV MVar5;
  uint uVar6;
  int iVar7;
  undefined8 in_RAX;
  MV mv;
  uint unused;
  MV local_38;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  piVar1 = (ms_params->ms_buffers).wsrc;
  piVar2 = (ms_params->ms_buffers).obmc_mask;
  paVar3 = ms_params->vfp;
  pbVar4 = (ms_params->ms_buffers).ref;
  MVar5 = get_mv_from_fullmv(this_mv);
  _local_38 = CONCAT44(local_34,MVar5);
  iVar7 = pbVar4->stride;
  uVar6 = (*paVar3->ovf)(pbVar4->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar7,iVar7,
                         piVar1,piVar2,&local_34);
  iVar7 = mv_err_cost_(&local_38,&ms_params->mv_cost_params);
  return iVar7 + uVar6;
}

Assistant:

static inline int get_obmc_mvpred_var(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV *this_mv) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const struct buf_2d *ref_buf = ms_buffers->ref;

  const MV mv = get_mv_from_fullmv(this_mv);
  unsigned int unused;

  return vfp->ovf(get_buf_from_fullmv(ref_buf, this_mv), ref_buf->stride, wsrc,
                  mask, &unused) +
         mv_err_cost_(&mv, mv_cost_params);
}